

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

void __thiscall
cs_impl::runtime_cs_ext::async_callable::async_callable(async_callable *this,var *fn,vector *data)

{
  callable *in_RDX;
  async_callable *in_RDI;
  callable *in_stack_ffffffffffffffb8;
  
  any::const_val<cs::callable>((any *)this);
  cs::callable::callable(in_RDX,in_stack_ffffffffffffffb8);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RDX,
             (vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_ffffffffffffffb8);
  detach_args(in_RDI);
  return;
}

Assistant:

async_callable(const var &fn, vector data) : func(fn.const_val<callable>()), args(std::move(data))
			{
				detach_args();
			}